

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode trynextip(connectdata *conn,int sockindex,int tempindex)

{
  int sock;
  CURLcode CVar1;
  Curl_addrinfo *ai;
  
  sock = conn->tempsock[(uint)tempindex];
  conn->tempsock[(uint)tempindex] = -1;
  CVar1 = CURLE_COULDNT_CONNECT;
  if (((sockindex == 0) && (conn->tempaddr[(uint)tempindex] != (Curl_addrinfo *)0x0)) &&
     (CVar1 = singleipconnect(conn,conn->tempaddr[(uint)tempindex],tempindex),
     CVar1 == CURLE_COULDNT_CONNECT)) {
    do {
      if ((conn->tempaddr[tempindex] == (Curl_addrinfo *)0x0) ||
         (ai = conn->tempaddr[tempindex]->ai_next, ai == (Curl_addrinfo *)0x0)) {
LAB_0010e4f4:
        conn->tempaddr[tempindex] = (Curl_addrinfo *)0x0;
        CVar1 = CURLE_COULDNT_CONNECT;
        break;
      }
      while (ai->ai_family != conn->tempfamily[tempindex]) {
        ai = ai->ai_next;
        if (ai == (Curl_addrinfo *)0x0) goto LAB_0010e4f4;
      }
      conn->tempaddr[tempindex] = ai;
      CVar1 = singleipconnect(conn,ai,tempindex);
    } while (CVar1 == CURLE_COULDNT_CONNECT);
  }
  if (sock != -1) {
    Curl_closesocket(conn,sock);
  }
  return CVar1;
}

Assistant:

static CURLcode trynextip(struct connectdata *conn,
                          int sockindex,
                          int tempindex)
{
  CURLcode result = CURLE_COULDNT_CONNECT;

  /* First clean up after the failed socket.
     Don't close it yet to ensure that the next IP's socket gets a different
     file descriptor, which can prevent bugs when the curl_multi_socket_action
     interface is used with certain select() replacements such as kqueue. */
  curl_socket_t fd_to_close = conn->tempsock[tempindex];
  conn->tempsock[tempindex] = CURL_SOCKET_BAD;

  if(sockindex == FIRSTSOCKET) {
    struct Curl_addrinfo *ai = conn->tempaddr[tempindex];

    while(ai) {
      if(ai) {
        result = singleipconnect(conn, ai, tempindex);
        if(result == CURLE_COULDNT_CONNECT) {
          ai = ainext(conn, tempindex, TRUE);
          continue;
        }
      }
      break;
    }
  }

  if(fd_to_close != CURL_SOCKET_BAD)
    Curl_closesocket(conn, fd_to_close);

  return result;
}